

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::TableGetMaxColumnWidth(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  float fVar2;
  float local_24;
  float min_column_distance;
  float max_width;
  ImGuiTableColumn *column;
  int column_n_local;
  ImGuiTable *table_local;
  
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  local_24 = 3.4028235e+38;
  fVar2 = table->CellPaddingX + table->CellPaddingX + table->MinColumnWidth + table->CellSpacingX1 +
          table->CellSpacingX2;
  if ((table->Flags & 0x1000000U) == 0) {
    if ((table->Flags & 0x40000U) == 0) {
      local_24 = (-table->CellPaddingX + -table->CellPaddingX +
                 (((-(float)(((int)table->ColumnsEnabledCount - (int)pIVar1->IndexWithinEnabledSet)
                            + -1) * fVar2 + (table->WorkRect).Max.x) - pIVar1->MinX) -
                 table->CellSpacingX2)) - table->OuterPaddingX;
    }
  }
  else if (pIVar1->DisplayOrder < table->FreezeColumnsRequest) {
    local_24 = ((((-(float)((int)table->FreezeColumnsRequest - (int)pIVar1->DisplayOrder) * fVar2 +
                  (table->InnerClipRect).Max.x) - pIVar1->MinX) - table->OuterPaddingX) -
               table->CellPaddingX) - table->CellSpacingX2;
  }
  return local_24;
}

Assistant:

float ImGui::TableGetMaxColumnWidth(const ImGuiTable* table, int column_n)
{
    const ImGuiTableColumn* column = &table->Columns[column_n];
    float max_width = FLT_MAX;
    const float min_column_distance = table->MinColumnWidth + table->CellPaddingX * 2.0f + table->CellSpacingX1 + table->CellSpacingX2;
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        // Frozen columns can't reach beyond visible width else scrolling will naturally break.
        if (column->DisplayOrder < table->FreezeColumnsRequest)
        {
            max_width = (table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - column->DisplayOrder) * min_column_distance) - column->MinX;
            max_width = max_width - table->OuterPaddingX - table->CellPaddingX - table->CellSpacingX2;
        }
    }
    else if ((table->Flags & ImGuiTableFlags_NoKeepColumnsVisible) == 0)
    {
        // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
        // sure they are all visible. Because of this we also know that all of the columns will always fit in
        // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
        // FIXME-TABLE: This is solved incorrectly but also quite a difficult problem to fix as we also want ClipRect width to match.
        // See "table_width_distrib" and "table_width_keep_visible" tests
        max_width = table->WorkRect.Max.x - (table->ColumnsEnabledCount - column->IndexWithinEnabledSet - 1) * min_column_distance - column->MinX;
        //max_width -= table->CellSpacingX1;
        max_width -= table->CellSpacingX2;
        max_width -= table->CellPaddingX * 2.0f;
        max_width -= table->OuterPaddingX;
    }
    return max_width;
}